

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tools.h
# Opt level: O2

void quicksort<server::crcinfo,bool(*)(server::crcinfo_const&,server::crcinfo_const&)>
               (crcinfo *start,crcinfo *end,_func_bool_crcinfo_ptr_crcinfo_ptr *fun)

{
  bool bVar1;
  ulong uVar2;
  crcinfo cVar3;
  crcinfo *pcVar4;
  crcinfo *pcVar5;
  crcinfo *pcVar6;
  crcinfo pivot;
  crcinfo local_40;
  crcinfo *local_38;
  
  do {
    uVar2 = (long)end - (long)start >> 3;
    if ((long)uVar2 < 0xb) {
      pcVar4 = start;
      local_38 = end;
      do {
        do {
          pcVar6 = pcVar4;
          pcVar4 = pcVar6 + 1;
          if (local_38 <= pcVar4) {
            return;
          }
          bVar1 = (*fun)(pcVar4,pcVar6);
        } while (!bVar1);
        local_40 = *pcVar4;
        do {
          pcVar5 = pcVar6;
          pcVar5[1] = *pcVar5;
          if (pcVar5 <= start) break;
          bVar1 = (*fun)(&local_40,pcVar5 + -1);
          pcVar6 = pcVar5 + -1;
        } while (bVar1);
        *pcVar5 = local_40;
      } while( true );
    }
    pcVar6 = (crcinfo *)(&start->crc + (uVar2 & 0xfffffffffffffffe));
    bVar1 = (*fun)(start,pcVar6);
    pcVar4 = end + -1;
    if (bVar1) {
      bVar1 = (*fun)(pcVar4,start);
      if (bVar1) {
        local_40 = *start;
        *start = *pcVar4;
      }
      else {
        bVar1 = (*fun)(pcVar4,pcVar6);
        if (!bVar1) {
          local_40 = *pcVar6;
          goto LAB_00140ed9;
        }
        local_40 = *pcVar4;
      }
      cVar3 = *pcVar6;
LAB_00140ed5:
      *pcVar4 = cVar3;
    }
    else {
      bVar1 = (*fun)(start,pcVar4);
      if (!bVar1) {
        bVar1 = (*fun)(pcVar6,pcVar4);
        if (bVar1) {
          local_40 = *pcVar4;
          *pcVar4 = *start;
          goto LAB_00140eae;
        }
        local_40 = *pcVar6;
        cVar3 = *start;
        *start = *pcVar4;
        goto LAB_00140ed5;
      }
      local_40 = *start;
LAB_00140eae:
      *start = *pcVar6;
    }
LAB_00140ed9:
    pcVar4 = end + -2;
    *pcVar6 = *pcVar4;
    pcVar6 = start + 1;
    do {
      while (pcVar5 = pcVar6, bVar1 = (*fun)(pcVar5,&local_40), bVar1) {
        pcVar5 = pcVar5 + 1;
        pcVar6 = pcVar5;
        if (pcVar4 <= pcVar5) goto LAB_00140f3e;
      }
      while( true ) {
        pcVar4 = pcVar4 + -1;
        bVar1 = (*fun)(&local_40,pcVar4);
        if (!bVar1) break;
        if (pcVar4 <= pcVar5) goto LAB_00140f3e;
      }
      cVar3 = *pcVar5;
      *pcVar5 = *pcVar4;
      *pcVar4 = cVar3;
      pcVar6 = pcVar5 + 1;
    } while (pcVar5 + 1 < pcVar4);
    pcVar5 = pcVar5 + 1;
LAB_00140f3e:
    end[-2] = *pcVar5;
    *pcVar5 = local_40;
    pcVar4 = pcVar5 + 1;
    if ((long)pcVar5 - (long)start < (long)end - (long)pcVar4) {
      quicksort<server::crcinfo,bool(*)(server::crcinfo_const&,server::crcinfo_const&)>
                (start,pcVar5,fun);
      start = pcVar4;
    }
    else {
      quicksort<server::crcinfo,bool(*)(server::crcinfo_const&,server::crcinfo_const&)>
                (pcVar4,end,fun);
      end = pcVar5;
    }
  } while( true );
}

Assistant:

static inline void quicksort(T *start, T *end, F fun)
{
    while(end-start > 10)
    {
        T *mid = &start[(end-start)/2], *i = start+1, *j = end-2, pivot;
        if(fun(*start, *mid)) /* start < mid */
        {
            if(fun(end[-1], *start)) { pivot = *start; *start = end[-1]; end[-1] = *mid; } /* end < start < mid */
            else if(fun(end[-1], *mid)) { pivot = end[-1]; end[-1] = *mid; } /* start <= end < mid */
            else { pivot = *mid; } /* start < mid <= end */
        }
        else if(fun(*start, end[-1])) { pivot = *start; *start = *mid; } /*mid <= start < end */
        else if(fun(*mid, end[-1])) { pivot = end[-1]; end[-1] = *start; *start = *mid; } /* mid < end <= start */
        else { pivot = *mid; swap(*start, end[-1]); }  /* end <= mid <= start */
        *mid = end[-2];
        do
        {
            while(fun(*i, pivot)) if(++i >= j) goto partitioned;
            while(fun(pivot, *--j)) if(i >= j) goto partitioned;
            swap(*i, *j);
        }
        while(++i < j);
    partitioned:
        end[-2] = *i;
        *i = pivot;
        
        if(i-start < end-(i+1))
        {
            quicksort(start, i, fun);
            start = i+1;
        }
        else
        {
            quicksort(i+1, end, fun);
            end = i;
        }
    }
    
    insertionsort(start, end, fun);
}